

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::ComputeTargetDepends(cmGlobalGenerator *this)

{
  cmTarget *t;
  bool bVar1;
  reference ppcVar2;
  mapped_type *deps;
  __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
  local_f8;
  __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
  local_f0;
  const_iterator ti;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *targets;
  undefined1 local_d0 [8];
  cmComputeTargetDepends ctd;
  cmGlobalGenerator *this_local;
  
  ctd.ComponentTail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  cmComputeTargetDepends::cmComputeTargetDepends((cmComputeTargetDepends *)local_d0,this);
  bVar1 = cmComputeTargetDepends::Compute((cmComputeTargetDepends *)local_d0);
  if (bVar1) {
    ti._M_current =
         (cmTarget **)cmComputeTargetDepends::GetTargets((cmComputeTargetDepends *)local_d0);
    local_f0._M_current =
         (cmTarget **)
         std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::begin
                   ((vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *)ti._M_current);
    while( true ) {
      local_f8._M_current =
           (cmTarget **)
           std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::end(ti._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_f0,&local_f8);
      if (!bVar1) break;
      ppcVar2 = __gnu_cxx::
                __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
                ::operator*(&local_f0);
      t = *ppcVar2;
      ppcVar2 = __gnu_cxx::
                __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
                ::operator*(&local_f0);
      deps = std::
             map<const_cmTarget_*,_cmTargetDependSet,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetDependSet>_>_>
             ::operator[](&this->TargetDependencies,ppcVar2);
      cmComputeTargetDepends::GetTargetDirectDepends((cmComputeTargetDepends *)local_d0,t,deps);
      __gnu_cxx::
      __normal_iterator<const_cmTarget_*const_*,_std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>_>
      ::operator++(&local_f0);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  cmComputeTargetDepends::~cmComputeTargetDepends((cmComputeTargetDepends *)local_d0);
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::ComputeTargetDepends()
{
  cmComputeTargetDepends ctd(this);
  if(!ctd.Compute())
    {
    return false;
    }
  std::vector<cmTarget const*> const& targets = ctd.GetTargets();
  for(std::vector<cmTarget const*>::const_iterator ti = targets.begin();
      ti != targets.end(); ++ti)
    {
    ctd.GetTargetDirectDepends(*ti, this->TargetDependencies[*ti]);
    }
  return true;
}